

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O3

void __thiscall cmExtraEclipseCDT4Generator::CreateProjectFile(cmExtraEclipseCDT4Generator *this)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  ostream *poVar7;
  _Base_ptr p_Var8;
  cmState *this_00;
  size_t sVar9;
  long lVar10;
  _Alloc_hider _Var11;
  string sourceLinkedResourceName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraNatures;
  string make;
  string makeArgs;
  string filename;
  string compilerId;
  cmGeneratedFileStream fout;
  allocator local_371;
  cmMakefile *local_370;
  string local_368;
  string local_348;
  string local_328;
  allocator local_301;
  string local_300;
  string local_2e0;
  string *local_2c0;
  long *local_2b8 [2];
  long local_2a8 [2];
  long *local_298;
  char *local_290;
  long local_288 [2];
  undefined1 local_278 [584];
  
  local_370 = (*(((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->LocalGenerators
                ).super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                _M_impl.super__Vector_impl_data._M_start)->Makefile;
  local_2b8[0] = local_2a8;
  pcVar3 = (this->HomeOutputDirectory)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2b8,pcVar3,pcVar3 + (this->HomeOutputDirectory)._M_string_length);
  std::__cxx11::string::append((char *)local_2b8);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_278,(char *)local_2b8[0],false);
  if (((byte)(*(_func_int **)(local_278._0_8_ + -0x18))[(long)(local_278 + 0x20)] & 5) != 0)
  goto LAB_00376d94;
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"CMAKE_C_COMPILER_ID","");
  pcVar6 = cmMakefile::GetSafeDefinition(local_370,&local_328);
  std::__cxx11::string::string((string *)&local_298,pcVar6,(allocator *)&local_300);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  if (local_290 == (char *)0x0) {
    local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"CMAKE_CXX_COMPILER_ID","")
    ;
    pcVar6 = cmMakefile::GetSafeDefinition(local_370,&local_328);
    strlen(pcVar6);
    std::__cxx11::string::_M_replace((ulong)&local_298,0,local_290,(ulong)pcVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<projectDescription>\n\t<name>",0x43);
  std::__cxx11::string::string
            ((string *)&local_300,(local_370->ProjectName)._M_dataplus._M_p,&local_371);
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"CMAKE_BUILD_TYPE","");
  pcVar6 = cmMakefile::GetSafeDefinition(local_370,&local_348);
  std::__cxx11::string::string((string *)&local_368,pcVar6,&local_301);
  local_2c0 = &this->HomeOutputDirectory;
  GetPathBasename(&local_2e0,local_2c0);
  GenerateProjectName(&local_328,&local_300,&local_368,&local_2e0);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_278,local_328._M_dataplus._M_p,local_328._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,
             "</name>\n\t<comment></comment>\n\t<projects>\n\t</projects>\n\t<buildSpec>\n\t\t<buildCommand>\n\t\t\t<name>org.eclipse.cdt.make.core.makeBuilder</name>\n\t\t\t<triggers>clean,full,incremental,</triggers>\n\t\t\t<arguments>\n"
             ,0xc9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_368.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != paVar2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,
             "\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.cleanBuildTarget</key>\n\t\t\t\t\t<value>clean</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.enableCleanBuild</key>\n\t\t\t\t\t<value>true</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.append_environment</key>\n\t\t\t\t\t<value>true</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.stopOnError</key>\n\t\t\t\t\t<value>true</value>\n\t\t\t\t</dictionary>\n"
             ,0x1da);
  local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"CMAKE_MAKE_PROGRAM","");
  pcVar6 = cmMakefile::GetRequiredDefinition(local_370,&local_300);
  std::__cxx11::string::string((string *)&local_328,pcVar6,(allocator *)&local_368);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  local_368._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_368,"CMAKE_ECLIPSE_MAKE_ARGUMENTS","");
  pcVar6 = cmMakefile::GetSafeDefinition(local_370,&local_368);
  std::__cxx11::string::string((string *)&local_300,pcVar6,(allocator *)&local_348);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != paVar2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,
             "\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.enabledIncrementalBuild</key>\n\t\t\t\t\t<value>true</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.build.command</key>\n\t\t\t\t\t<value>"
             ,0xd3);
  local_368._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_368,local_328._M_dataplus._M_p,
             local_328._M_dataplus._M_p + local_328._M_string_length);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_278,local_368._M_dataplus._M_p,local_368._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,
             "</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.contents</key>\n\t\t\t\t\t<value>org.eclipse.cdt.make.core.activeConfigSettings</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.build.target.inc</key>\n\t\t\t\t\t<value>all</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.build.arguments</key>\n\t\t\t\t\t<value>"
             ,0x181);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_300._M_dataplus._M_p,local_300._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,
             "</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.buildLocation</key>\n\t\t\t\t\t<value>"
             ,0x70);
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  pcVar3 = (this->HomeOutputDirectory)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_348,pcVar3,pcVar3 + (this->HomeOutputDirectory)._M_string_length);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_348._M_dataplus._M_p,local_348._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,
             "</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.useDefaultBuildCmd</key>\n\t\t\t\t\t<value>false</value>\n\t\t\t\t</dictionary>\n"
             ,0x95);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != paVar2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,
             "\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.environment</key>\n\t\t\t\t\t<value>VERBOSE=1|CMAKE_NO_VERBOSE=1|"
             ,0x70);
  iVar5 = std::__cxx11::string::compare((char *)&local_298);
  if (iVar5 == 0) {
    AddEnvVar((cmGeneratedFileStream *)local_278,"PATH",local_370);
    AddEnvVar((cmGeneratedFileStream *)local_278,"INCLUDE",local_370);
    AddEnvVar((cmGeneratedFileStream *)local_278,"LIB",local_370);
    pcVar6 = "LIBPATH";
LAB_0037683b:
    AddEnvVar((cmGeneratedFileStream *)local_278,pcVar6,local_370);
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)&local_298);
    if (iVar5 == 0) {
      pcVar6 = "INTEL_LICENSE_FILE";
      goto LAB_0037683b;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"</value>\n\t\t\t\t</dictionary>\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,
             "\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.enableFullBuild</key>\n\t\t\t\t\t<value>true</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.build.target.auto</key>\n\t\t\t\t\t<value>all</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.enableAutoBuild</key>\n\t\t\t\t\t<value>false</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.build.target.clean</key>\n\t\t\t\t\t<value>clean</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.fullBuildTarget</key>\n\t\t\t\t\t<value>all</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.buildArguments</key>\n\t\t\t\t\t<value></value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.build.location</key>\n\t\t\t\t\t<value>"
             ,0x31a);
  pcVar3 = (this->HomeOutputDirectory)._M_dataplus._M_p;
  local_368._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_368,pcVar3,pcVar3 + (this->HomeOutputDirectory)._M_string_length);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_278,local_368._M_dataplus._M_p,local_368._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,
             "</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.autoBuildTarget</key>\n\t\t\t\t\t<value>all</value>\n\t\t\t\t</dictionary>\n"
             ,0x90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != paVar2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,
             "\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.core.errorOutputParser</key>\n\t\t\t\t\t<value>"
             ,0x54);
  iVar5 = std::__cxx11::string::compare((char *)&local_298);
  if (iVar5 == 0) {
    lVar10 = 0x23;
    pcVar6 = "org.eclipse.cdt.core.VCErrorParser;";
LAB_00376942:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar6,lVar10);
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)&local_298);
    if (iVar5 == 0) {
      lVar10 = 0x24;
      pcVar6 = "org.eclipse.cdt.core.ICCErrorParser;";
      goto LAB_00376942;
    }
  }
  pcVar6 = "org.eclipse.cdt.core.MakeErrorParser;";
  if ((ulong)this->SupportsGmakeErrorParser != 0) {
    pcVar6 = "org.eclipse.cdt.core.GmakeErrorParser;";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,pcVar6,(ulong)this->SupportsGmakeErrorParser + 0x25);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,
             "org.eclipse.cdt.core.GCCErrorParser;org.eclipse.cdt.core.GASErrorParser;org.eclipse.cdt.core.GLDErrorParser;</value>\n\t\t\t\t</dictionary>\n"
             ,0x87);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,
             "\t\t\t</arguments>\n\t\t</buildCommand>\n\t\t<buildCommand>\n\t\t\t<name>org.eclipse.cdt.make.core.ScannerConfigBuilder</name>\n\t\t\t<arguments>\n\t\t\t</arguments>\n\t\t</buildCommand>\n\t</buildSpec>\n"
             ,0xb1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,
             "\t<natures>\n\t\t<nature>org.eclipse.cdt.make.core.makeNature</nature>\n\t\t<nature>org.eclipse.cdt.make.core.ScannerConfigNature</nature>\n"
             ,0x84);
  p_Var8 = (this->Natures)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->Natures)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var8 != p_Var1) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\t\t<nature>",10);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_278,*(char **)(p_Var8 + 1),(long)p_Var8[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"</nature>\n",10);
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != p_Var1);
  }
  this_00 = cmMakefile::GetState(local_370);
  paVar2 = &local_368.field_2;
  local_368._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"ECLIPSE_EXTRA_NATURES","");
  pcVar6 = cmState::GetGlobalProperty(this_00,&local_368);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != paVar2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  if (pcVar6 != (char *)0x0) {
    local_348._M_dataplus._M_p = (pointer)0x0;
    local_348._M_string_length = 0;
    local_348.field_2._M_allocated_capacity = 0;
    local_368._M_dataplus._M_p = (pointer)paVar2;
    sVar9 = strlen(pcVar6);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,pcVar6,pcVar6 + sVar9);
    cmSystemTools::ExpandListArgument
              (&local_368,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_348,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != paVar2) {
      operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
    }
    if (local_348._M_dataplus._M_p != (pointer)local_348._M_string_length) {
      _Var11._M_p = local_348._M_dataplus._M_p;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\t\t<nature>",10);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_278,*(char **)_Var11._M_p,
                            *(undefined8 *)((long)_Var11._M_p + 8));
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"</nature>\n",10);
        _Var11._M_p = _Var11._M_p + 0x20;
      } while (_Var11._M_p != (pointer)local_348._M_string_length);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_348);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\t</natures>\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"\t<linkedResources>\n",0x13);
  if (this->IsOutOfSourceBuild == true) {
    local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"[Source directory]","");
    pcVar6 = cmMakefile::GetCurrentSourceDirectory(local_370);
    std::__cxx11::string::string((string *)&local_2e0,pcVar6,&local_371);
    local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_348,local_2e0._M_dataplus._M_p,
               local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
    }
    bVar4 = cmsys::SystemTools::IsSubDirectory(local_2c0,&local_348);
    if (!bVar4) {
      local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2e0,local_348._M_dataplus._M_p,
                 local_348._M_dataplus._M_p + local_348._M_string_length);
      AppendLinkedResource((cmGeneratedFileStream *)local_278,&local_368,&local_2e0,LinkToFolder);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->SrcLinkedResources,&local_368);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != &local_368.field_2) {
      operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
    }
  }
  if (this->SupportsVirtualFolders == true) {
    CreateLinksToSubprojects(this,(cmGeneratedFileStream *)local_278,local_2c0);
    CreateLinksForTargets(this,(cmGeneratedFileStream *)local_278);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"\t</linkedResources>\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"</projectDescription>\n",0x16);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  if (local_298 != local_288) {
    operator_delete(local_298,local_288[0] + 1);
  }
LAB_00376d94:
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
  if (local_2b8[0] != local_2a8) {
    operator_delete(local_2b8[0],local_2a8[0] + 1);
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateProjectFile()
{
  cmMakefile* mf
    = this->GlobalGenerator->GetLocalGenerators()[0]->GetMakefile();

  const std::string filename = this->HomeOutputDirectory + "/.project";

  cmGeneratedFileStream fout(filename.c_str());
  if (!fout)
    {
    return;
    }

  std::string compilerId = mf->GetSafeDefinition("CMAKE_C_COMPILER_ID");
  if (compilerId.empty())  // no C compiler, try the C++ compiler:
    {
    compilerId = mf->GetSafeDefinition("CMAKE_CXX_COMPILER_ID");
    }

  fout <<
    "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
    "<projectDescription>\n"
    "\t<name>" <<
    this->GenerateProjectName(mf->GetProjectName(),
                              mf->GetSafeDefinition("CMAKE_BUILD_TYPE"),
                              this->GetPathBasename(this->HomeOutputDirectory))
    << "</name>\n"
    "\t<comment></comment>\n"
    "\t<projects>\n"
    "\t</projects>\n"
    "\t<buildSpec>\n"
    "\t\t<buildCommand>\n"
    "\t\t\t<name>org.eclipse.cdt.make.core.makeBuilder</name>\n"
    "\t\t\t<triggers>clean,full,incremental,</triggers>\n"
    "\t\t\t<arguments>\n"
    ;

  // use clean target
  fout <<
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.cleanBuildTarget</key>\n"
    "\t\t\t\t\t<value>clean</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.enableCleanBuild</key>\n"
    "\t\t\t\t\t<value>true</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.append_environment</key>\n"
    "\t\t\t\t\t<value>true</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.stopOnError</key>\n"
    "\t\t\t\t\t<value>true</value>\n"
    "\t\t\t\t</dictionary>\n"
    ;

  // set the make command
  std::string make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  const std::string makeArgs = mf->GetSafeDefinition(
                                               "CMAKE_ECLIPSE_MAKE_ARGUMENTS");

  fout <<
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.enabledIncrementalBuild</key>\n"
    "\t\t\t\t\t<value>true</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.build.command</key>\n"
    "\t\t\t\t\t<value>" << this->GetEclipsePath(make) << "</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.contents</key>\n"
    "\t\t\t\t\t<value>org.eclipse.cdt.make.core.activeConfigSettings</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.build.target.inc</key>\n"
    "\t\t\t\t\t<value>all</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.build.arguments</key>\n"
    "\t\t\t\t\t<value>" << makeArgs << "</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.buildLocation</key>\n"
    "\t\t\t\t\t<value>"
     << this->GetEclipsePath(this->HomeOutputDirectory) << "</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.useDefaultBuildCmd</key>\n"
    "\t\t\t\t\t<value>false</value>\n"
    "\t\t\t\t</dictionary>\n"
    ;

  // set project specific environment
  fout <<
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.environment</key>\n"
    "\t\t\t\t\t<value>VERBOSE=1|CMAKE_NO_VERBOSE=1|"  //verbose Makefile output
    ;
  // set vsvars32.bat environment available at CMake time,
  //   but not necessarily when eclipse is open
  if (compilerId == "MSVC")
    {
    AddEnvVar(fout, "PATH", mf);
    AddEnvVar(fout, "INCLUDE", mf);
    AddEnvVar(fout, "LIB", mf);
    AddEnvVar(fout, "LIBPATH", mf);
    }
  else if (compilerId == "Intel")
    {
    // if the env.var is set, use this one and put it in the cache
    // if the env.var is not set, but the value is in the cache,
    // use it from the cache:
    AddEnvVar(fout, "INTEL_LICENSE_FILE", mf);
    }
  fout <<
    "</value>\n"
    "\t\t\t\t</dictionary>\n"
    ;

  fout <<
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.enableFullBuild</key>\n"
    "\t\t\t\t\t<value>true</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.build.target.auto</key>\n"
    "\t\t\t\t\t<value>all</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.enableAutoBuild</key>\n"
    "\t\t\t\t\t<value>false</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.build.target.clean</key>\n"
    "\t\t\t\t\t<value>clean</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.fullBuildTarget</key>\n"
    "\t\t\t\t\t<value>all</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.buildArguments</key>\n"
    "\t\t\t\t\t<value></value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.build.location</key>\n"
    "\t\t\t\t\t<value>"
    << this->GetEclipsePath(this->HomeOutputDirectory) << "</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.autoBuildTarget</key>\n"
    "\t\t\t\t\t<value>all</value>\n"
    "\t\t\t\t</dictionary>\n"
    ;

  // set error parsers
  fout <<
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.core.errorOutputParser</key>\n"
    "\t\t\t\t\t<value>"
    ;
  if (compilerId == "MSVC")
    {
    fout << "org.eclipse.cdt.core.VCErrorParser;";
    }
  else if (compilerId == "Intel")
    {
    fout << "org.eclipse.cdt.core.ICCErrorParser;";
    }

  if (this->SupportsGmakeErrorParser)
    {
    fout << "org.eclipse.cdt.core.GmakeErrorParser;";
    }
  else
    {
    fout << "org.eclipse.cdt.core.MakeErrorParser;";
    }

  fout <<
    "org.eclipse.cdt.core.GCCErrorParser;"
    "org.eclipse.cdt.core.GASErrorParser;"
    "org.eclipse.cdt.core.GLDErrorParser;"
    "</value>\n"
    "\t\t\t\t</dictionary>\n"
    ;

  fout <<
    "\t\t\t</arguments>\n"
    "\t\t</buildCommand>\n"
    "\t\t<buildCommand>\n"
    "\t\t\t<name>org.eclipse.cdt.make.core.ScannerConfigBuilder</name>\n"
    "\t\t\t<arguments>\n"
    "\t\t\t</arguments>\n"
    "\t\t</buildCommand>\n"
    "\t</buildSpec>\n"
    ;

  // set natures for c/c++ projects
  fout <<
    "\t<natures>\n"
    "\t\t<nature>org.eclipse.cdt.make.core.makeNature</nature>\n"
    "\t\t<nature>org.eclipse.cdt.make.core.ScannerConfigNature</nature>\n";

  for (std::set<std::string>::const_iterator nit=this->Natures.begin();
       nit != this->Natures.end(); ++nit)
    {
    fout << "\t\t<nature>" << *nit << "</nature>\n";
    }

  if (const char *extraNaturesProp = mf->GetState()
        ->GetGlobalProperty("ECLIPSE_EXTRA_NATURES"))
    {
    std::vector<std::string> extraNatures;
    cmSystemTools::ExpandListArgument(extraNaturesProp, extraNatures);
    for (std::vector<std::string>::const_iterator nit = extraNatures.begin();
         nit != extraNatures.end(); ++nit)
      {
      fout << "\t\t<nature>" << *nit << "</nature>\n";
      }
    }

  fout << "\t</natures>\n";

  fout << "\t<linkedResources>\n";
  // create linked resources
  if (this->IsOutOfSourceBuild)
    {
    // create a linked resource to CMAKE_SOURCE_DIR
    // (this is not done anymore for each project because of
    // http://public.kitware.com/Bug/view.php?id=9978 and because I found it
    // actually quite confusing in bigger projects with many directories and
    // projects, Alex

    std::string sourceLinkedResourceName = "[Source directory]";
    std::string linkSourceDirectory = this->GetEclipsePath(
                                             mf->GetCurrentSourceDirectory());
    // .project dir can't be subdir of a linked resource dir
    if (!cmSystemTools::IsSubDirectory(this->HomeOutputDirectory,
                                         linkSourceDirectory))
      {
      this->AppendLinkedResource(fout, sourceLinkedResourceName,
                                 this->GetEclipsePath(linkSourceDirectory),
                                 LinkToFolder);
      this->SrcLinkedResources.push_back(sourceLinkedResourceName);
      }

    }

  if (this->SupportsVirtualFolders)
    {
    this->CreateLinksToSubprojects(fout, this->HomeOutputDirectory);

    this->CreateLinksForTargets(fout);
    }

  fout << "\t</linkedResources>\n";

  fout << "</projectDescription>\n";
}